

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O2

int readbtable(fitsfile *fptr,int *status)

{
  int *piVar1;
  int *piVar2;
  fitsfile *pfVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int anynull;
  int *local_58;
  fitsfile *local_50;
  long nrows;
  float elapcpu;
  int hdutype;
  double elapse;
  
  iVar4 = ffmrhd(fptr,1,&hdutype,status);
  if (iVar4 == 0) {
    local_50 = fptr;
    ffgrsz(fptr,&nrows,status);
    lVar7 = 20000;
    if (nrows < 20000) {
      lVar7 = nrows;
    }
    nrows = lVar7;
    printf("Read back BINTABLE                              ");
    local_58 = status;
    marktime(status);
    pfVar3 = local_50;
    piVar1 = local_58;
    lVar7 = 1;
    for (lVar6 = 2500000; piVar2 = local_58, lVar6 != 0; lVar6 = lVar6 - lVar5) {
      lVar5 = nrows;
      if (lVar6 <= nrows) {
        lVar5 = lVar6;
      }
      ffgcvj(pfVar3,1,lVar7,1,lVar5,0,sarray,&anynull,piVar1);
      ffgcvj(pfVar3,2,lVar7,1,lVar5,0,sarray,&anynull,piVar1);
      lVar7 = lVar7 + lVar5;
    }
    gettime(&elapse,&elapcpu,local_58);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,elapse,
           (double)(float)(((double)elapcpu / elapse) * 100.0),(double)(float)(20.0 / elapse));
    return *piVar2;
  }
  printerror(*status);
}

Assistant:

int readbtable( fitsfile *fptr, int *status )

    /************************************************************/
    /* read and print data values from the binary table */
    /************************************************************/
{
    int hdutype, anynull;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    long lnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the table */
    if ( fits_movrel_hdu(fptr, 1, &hdutype, status) ) 
           printerror( *status );

    /* get table row size and optimum number of rows to read per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    
    /*  read the columns */  
    nremain = BROWS;

    printf("Read back BINTABLE                              ");
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffgcvj(fptr, 1, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      ffgcvj(fptr, 2, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      firstrow += ntodo; 
      nremain  -= ntodo;
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}